

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O0

void object_proxy_get_property(GObject *gobject,guint prop_id,GValue *value,GParamSpec *pspec)

{
  gchar *pgVar1;
  GType GVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  guint _glib__property_id;
  GParamSpec *_glib__pspec;
  GObject *_glib__object;
  GDBusInterface *interface;
  ObjectProxy *object;
  GParamSpec *pspec_local;
  GValue *value_local;
  guint prop_id_local;
  GObject *gobject_local;
  
  GVar2 = object_proxy_get_type();
  uVar3 = g_type_check_instance_cast(gobject,GVar2);
  if (prop_id == 1) {
    uVar4 = g_dbus_object_get_type();
    uVar3 = g_type_check_instance_cast(uVar3,uVar4);
    uVar3 = g_dbus_object_get_interface(uVar3,"io.mangoh.Testing.Greetable");
    g_value_take_object(value,uVar3);
  }
  else {
    pgVar1 = pspec->name;
    uVar3 = g_type_name(((pspec->g_type_instance).g_class)->g_type);
    uVar4 = g_type_name(((gobject->g_type_instance).g_class)->g_type);
    g_log(0,0x10,"%s:%d: invalid %s id %u for \"%s\" of type \'%s\' in \'%s\'",
          "/workspace/llm4binary/github/license_all_cmakelists_25/dpfrey[P]D-Bus_Example/build_O0/basics_gen.c"
          ,0x672,"property",prop_id,pgVar1,uVar3,uVar4);
  }
  return;
}

Assistant:

static void
object_proxy_get_property (GObject      *gobject,
  guint         prop_id,
  GValue       *value,
  GParamSpec   *pspec)
{
  ObjectProxy *object = OBJECT_PROXY (gobject);
  GDBusInterface *interface;

  switch (prop_id)
    {
    case 1:
      interface = g_dbus_object_get_interface (G_DBUS_OBJECT (object), "io.mangoh.Testing.Greetable");
      g_value_take_object (value, interface);
      break;

    default:
      G_OBJECT_WARN_INVALID_PROPERTY_ID (gobject, prop_id, pspec);
      break;
  }
}